

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O0

REF_STATUS ref_mpi_allsum(REF_MPI ref_mpi,void *value,REF_INT n,REF_TYPE type)

{
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  void *temp;
  REF_INT i;
  REF_TYPE type_local;
  REF_INT n_local;
  void *value_local;
  REF_MPI ref_mpi_local;
  
  if (type == 1) {
    if (n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x34d,
             "ref_mpi_allsum","malloc temp of REF_INT negative");
      return 1;
    }
    _ref_private_macro_code_rss_1 = malloc((long)n << 2);
    if (_ref_private_macro_code_rss_1 == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x34d,
             "ref_mpi_allsum","malloc temp of REF_INT NULL");
      return 2;
    }
    for (temp._4_4_ = 0; temp._4_4_ < n; temp._4_4_ = temp._4_4_ + 1) {
      *(undefined4 *)((long)_ref_private_macro_code_rss_1 + (long)temp._4_4_ * 4) =
           *(undefined4 *)((long)value + (long)temp._4_4_ * 4);
    }
  }
  else if (type == 2) {
    if (n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x351,
             "ref_mpi_allsum","malloc temp of REF_LONG negative");
      return 1;
    }
    _ref_private_macro_code_rss_1 = malloc((long)n << 3);
    if (_ref_private_macro_code_rss_1 == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x351,
             "ref_mpi_allsum","malloc temp of REF_LONG NULL");
      return 2;
    }
    for (temp._4_4_ = 0; temp._4_4_ < n; temp._4_4_ = temp._4_4_ + 1) {
      *(undefined8 *)((long)_ref_private_macro_code_rss_1 + (long)temp._4_4_ * 8) =
           *(undefined8 *)((long)value + (long)temp._4_4_ * 8);
    }
  }
  else {
    if (type != 3) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x359,
             "ref_mpi_allsum",6,"data type");
      return 6;
    }
    if (n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x355,
             "ref_mpi_allsum","malloc temp of REF_DBL negative");
      return 1;
    }
    _ref_private_macro_code_rss_1 = malloc((long)n << 3);
    if (_ref_private_macro_code_rss_1 == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x355,
             "ref_mpi_allsum","malloc temp of REF_DBL NULL");
      return 2;
    }
    for (temp._4_4_ = 0; temp._4_4_ < n; temp._4_4_ = temp._4_4_ + 1) {
      *(undefined8 *)((long)_ref_private_macro_code_rss_1 + (long)temp._4_4_ * 8) =
           *(undefined8 *)((long)value + (long)temp._4_4_ * 8);
    }
  }
  ref_mpi_local._4_4_ = ref_mpi_sum(ref_mpi,_ref_private_macro_code_rss_1,value,n,type);
  if (ref_mpi_local._4_4_ == 0) {
    if (_ref_private_macro_code_rss_1 != (void *)0x0) {
      free(_ref_private_macro_code_rss_1);
    }
    ref_mpi_local._4_4_ = ref_mpi_bcast(ref_mpi,value,n,type);
    if (ref_mpi_local._4_4_ == 0) {
      ref_mpi_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x35d,
             "ref_mpi_allsum",(ulong)ref_mpi_local._4_4_,"bcast");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x35b,
           "ref_mpi_allsum",(ulong)ref_mpi_local._4_4_,"sum");
  }
  return ref_mpi_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_allsum(REF_MPI ref_mpi, void *value, REF_INT n,
                                  REF_TYPE type) {
  REF_INT i;
  void *temp = NULL;
  switch (type) {
    case REF_INT_TYPE:
      ref_malloc(temp, n, REF_INT);
      for (i = 0; i < n; i++) ((REF_INT *)temp)[i] = ((REF_INT *)value)[i];
      break;
    case REF_LONG_TYPE:
      ref_malloc(temp, n, REF_LONG);
      for (i = 0; i < n; i++) ((REF_LONG *)temp)[i] = ((REF_LONG *)value)[i];
      break;
    case REF_DBL_TYPE:
      ref_malloc(temp, n, REF_DBL);
      for (i = 0; i < n; i++) ((REF_DBL *)temp)[i] = ((REF_DBL *)value)[i];
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }
  RSS(ref_mpi_sum(ref_mpi, temp, value, n, type), "sum");
  ref_free(temp);
  RSS(ref_mpi_bcast(ref_mpi, value, n, type), "bcast")
  return REF_SUCCESS;
}